

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O2

TimeRepr * timerepr_from_usecs(TimeRepr *__return_storage_ptr__,int64_t usecs)

{
  int iVar1;
  int64_t x;
  long lVar2;
  
  __return_storage_ptr__->days = (int32_t)(usecs / 86400000000);
  iVar1 = (int)((usecs % 86400000000) / 3600000000);
  __return_storage_ptr__->hours = iVar1;
  lVar2 = (long)iVar1 * -3600000000 + usecs % 86400000000;
  iVar1 = (int)(lVar2 / 60000000);
  __return_storage_ptr__->minutes = iVar1;
  lVar2 = (long)iVar1 * -60000000 + lVar2;
  iVar1 = (int)(lVar2 / 1000000);
  __return_storage_ptr__->seconds = iVar1;
  lVar2 = (long)iVar1 * -1000000 + lVar2;
  iVar1 = (int)(lVar2 / 1000);
  __return_storage_ptr__->milliseconds = iVar1;
  __return_storage_ptr__->microseconds = (int)lVar2 + iVar1 * -1000;
  return __return_storage_ptr__;
}

Assistant:

TimeRepr timerepr_from_usecs(int64_t usecs) {
    TimeRepr result = {0};

    int64_t x = usecs;

    result.days = x / NUM_USECS_IN_A_DAY;
    x -= result.days * NUM_USECS_IN_A_DAY;

    result.hours = x / NUM_USECS_IN_AN_HOUR;
    x -= result.hours * NUM_USECS_IN_AN_HOUR;

    result.minutes = x / NUM_USECS_IN_A_MINUTE;
    x -= result.minutes * NUM_USECS_IN_A_MINUTE;

    result.seconds = x / NUM_USECS_IN_A_SEC;
    x -= result.seconds * NUM_USECS_IN_A_SEC;

    result.milliseconds = x / NUM_USECS_IN_A_MSEC;
    x -= result.milliseconds * NUM_USECS_IN_A_MSEC;

    result.microseconds = x;

    return result;
}